

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O2

void __thiscall asmjit::_abi_1_10::ZoneBitVector::or_(ZoneBitVector *this,ZoneBitVector *other)

{
  uint uVar1;
  BitWord *pBVar2;
  BitWord *pBVar3;
  ulong uVar4;
  
  pBVar2 = this->_data;
  uVar1 = this->_size;
  if (other->_size < this->_size) {
    uVar1 = other->_size;
  }
  pBVar3 = other->_data;
  for (uVar4 = 0; uVar1 + 0x3f >> 6 != uVar4; uVar4 = uVar4 + 1) {
    pBVar2[uVar4] = pBVar2[uVar4] | pBVar3[uVar4];
  }
  uVar1 = this->_size;
  if ((uVar1 & 0x3f) != 0) {
    this->_data[uVar1 >> 6] = this->_data[uVar1 >> 6] & ~(-1L << ((byte)uVar1 & 0x3f));
  }
  return;
}

Assistant:

ASMJIT_FORCE_INLINE void or_(const ZoneBitVector& other) noexcept {
    BitWord* dst = _data;
    const BitWord* src = other._data;

    uint32_t commonBitWordCount = _wordsPerBits(Support::min(_size, other._size));
    for (uint32_t i = 0; i < commonBitWordCount; i++)
      dst[i] = dst[i] | src[i];
    _clearUnusedBits();
  }